

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_read_char(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_318;
  operation local_314 [2];
  operand local_30c [2];
  operation local_304 [2];
  operand local_2fc;
  operation local_2f8;
  operand local_2f4 [3];
  operation local_2e8 [2];
  operand local_2e0 [2];
  operation local_2d8 [2];
  operand local_2d0 [2];
  operation local_2c8 [2];
  operand local_2c0 [2];
  operation local_2b8 [2];
  operand local_2b0 [2];
  operation local_2a8;
  operand local_2a4 [2];
  operation local_29c;
  operand local_298 [2];
  operation local_290;
  operand local_28c [2];
  operation local_284 [2];
  operand local_27c [2];
  operation local_274;
  unsigned_long local_270;
  operand local_264 [2];
  operation local_25c [2];
  operand local_254 [2];
  operation local_24c [2];
  operand local_244 [2];
  operation local_23c [2];
  operand local_234 [2];
  operation local_22c [3];
  operand local_220 [2];
  operation local_218;
  operand local_214 [3];
  operation local_208 [2];
  operand local_200 [2];
  operation local_1f8;
  operand local_1f4;
  operation local_1f0;
  operand local_1ec;
  operation local_1e8;
  operand local_1e4;
  operation local_1e0;
  operand local_1dc [2];
  operation local_1d4;
  operand local_1d0;
  operation local_1cc;
  code *local_1c8;
  operand local_1c0 [2];
  operation local_1b8;
  operand local_1b4 [2];
  operation local_1ac;
  operand local_1a8 [2];
  operation local_1a0 [2];
  operand local_198 [2];
  operation local_190;
  operand local_18c [2];
  operation local_184 [2];
  operand local_17c [2];
  operation local_174 [2];
  operand local_16c [2];
  operation local_164 [2];
  operand local_15c [2];
  operation local_154 [2];
  operand local_14c [2];
  operation local_144;
  operand local_140;
  operation local_13c;
  operand local_138;
  operation local_134;
  operand local_130;
  operation local_12c;
  unsigned_long local_128;
  operand local_11c [2];
  operation local_114 [2];
  operand local_10c [2];
  operation local_104 [2];
  operand local_fc [2];
  operation local_f4;
  undefined1 local_f0 [8];
  string eof_lab;
  string no_buffer_read;
  operand local_a8;
  operation local_a4 [2];
  operand local_9c [2];
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,psVar1,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_if_arg_does_not_point_to_port(code,RCX,R11,(string *)local_38);
  }
  local_94 = MOV;
  local_9c[1] = 0x14;
  local_9c[0] = MEM_RCX;
  local_a4[1] = 0x28;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_94,local_9c + 1,local_9c,(int *)(local_a4 + 1));
  local_a4[0] = MOV;
  local_a8 = R15;
  no_buffer_read.field_2._12_4_ = 0x1b;
  no_buffer_read.field_2._8_4_ = 0x38;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_a4,&stack0xffffffffffffff58,
             (operand *)(no_buffer_read.field_2._M_local_buf + 0xc),
             (int *)(no_buffer_read.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&eof_lab.field_2 + 8),psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_f0,psVar1,lab_01);
  local_f4 = CMP;
  local_fc[1] = 0x14;
  local_fc[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_f4,local_fc + 1,local_fc);
  local_104[1] = 0x30;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_104 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&eof_lab.field_2 + 8));
  local_104[0] = MOV;
  local_10c[1] = 0x14;
  local_10c[0] = MEM_RCX;
  local_114[1] = 0x20;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_104,local_10c + 1,local_10c,(int *)(local_114 + 1));
  local_114[0] = AND;
  local_11c[1] = 0x14;
  local_11c[0] = NUMBER;
  local_128 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_114,local_11c + 1,local_11c,&local_128);
  local_12c = PUSH;
  local_130 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_12c,&local_130);
  local_134 = PUSH;
  local_138 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_134,&local_138);
  local_13c = PUSH;
  local_140 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_13c,&local_140);
  local_144 = MOV;
  local_14c[1] = 0xe;
  local_14c[0] = MEM_RCX;
  local_154[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_144,local_14c + 1,local_14c,(int *)(local_154 + 1));
  local_154[0] = SAR;
  local_15c[1] = 0xe;
  local_15c[0] = NUMBER;
  local_164[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_154,local_15c + 1,local_15c,(int *)(local_164 + 1));
  local_164[0] = MOV;
  local_16c[1] = 0xc;
  local_16c[0] = MEM_RCX;
  local_174[1] = 0x28;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_164,local_16c + 1,local_16c,(int *)(local_174 + 1));
  local_174[0] = SAR;
  local_17c[1] = 0xc;
  local_17c[0] = NUMBER;
  local_184[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_174,local_17c + 1,local_17c,(int *)(local_184 + 1));
  local_184[0] = MOV;
  local_18c[1] = 0xd;
  local_18c[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_184,local_18c + 1,local_18c);
  local_190 = ADD;
  local_198[1] = 0xd;
  local_198[0] = NUMBER;
  local_1a0[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_190,local_198 + 1,local_198,(int *)(local_1a0 + 1));
  save_before_foreign_call(code);
  align_stack(code);
  local_1a0[0] = MOV;
  local_1a8[1] = 0x18;
  local_1a8[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1a0,local_1a8 + 1,local_1a8);
  local_1ac = XOR;
  local_1b4[1] = 9;
  local_1b4[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1ac,local_1b4 + 1,local_1b4);
  local_1b8 = MOV;
  local_1c0[1] = 0x14;
  local_1c0[0] = NUMBER;
  local_1c8 = _skiwi_read;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1b8,local_1c0 + 1,local_1c0,(unsigned_long *)&local_1c8);
  local_1cc = CALLEXTERNAL;
  local_1d0 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1cc,&local_1d0);
  local_1d4 = MOV;
  local_1dc[1] = 0x13;
  local_1dc[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1d4,local_1dc + 1,local_1dc);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_1e0 = POP;
  local_1e4 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1e0,&local_1e4);
  local_1e8 = POP;
  local_1ec = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1e8,&local_1ec);
  local_1f0 = POP;
  local_1f4 = RDI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1f0,&local_1f4);
  local_1f8 = SHL;
  local_200[1] = 9;
  local_200[0] = NUMBER;
  local_208[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1f8,local_200 + 1,local_200,(int *)(local_208 + 1));
  local_208[0] = MOV;
  local_214[2] = 0x1b;
  local_214[1] = 0x38;
  local_214[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_208,local_214 + 2,(int *)(local_214 + 1),local_214);
  local_218 = CMP;
  local_220[1] = 9;
  local_220[0] = NUMBER;
  local_22c[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_218,local_220 + 1,local_220,(int *)(local_22c + 2));
  local_22c[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_22c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  local_22c[0] = XOR;
  local_234[1] = 0x14;
  local_234[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_22c,local_234 + 1,local_234);
  local_23c[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_23c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&eof_lab.field_2 + 8));
  local_23c[0] = MOV;
  local_244[1] = 0x18;
  local_244[0] = MEM_RCX;
  local_24c[1] = 0x20;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_23c,local_244 + 1,local_244,(int *)(local_24c + 1));
  local_24c[0] = SAR;
  local_254[1] = 0x14;
  local_254[0] = NUMBER;
  local_25c[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_24c,local_254 + 1,local_254,(int *)(local_25c + 1));
  local_25c[0] = AND;
  local_264[1] = 0x18;
  local_264[0] = NUMBER;
  local_270 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_25c,local_264 + 1,local_264,&local_270);
  local_274 = ADD;
  local_27c[1] = 0x14;
  local_27c[0] = NUMBER;
  local_284[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_274,local_27c + 1,local_27c,(int *)(local_284 + 1));
  local_284[0] = ADD;
  local_28c[1] = 0x18;
  local_28c[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_284,local_28c + 1,local_28c);
  local_290 = MOV;
  local_298[1] = 1;
  local_298[0] = BYTE_MEM_R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_290,local_298 + 1,local_298);
  local_29c = MOVZX;
  local_2a4[1] = 9;
  local_2a4[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_29c,local_2a4 + 1,local_2a4);
  local_2a8 = SHL;
  local_2b0[1] = 9;
  local_2b0[0] = NUMBER;
  local_2b8[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_2a8,local_2b0 + 1,local_2b0,(int *)(local_2b8 + 1));
  local_2b8[0] = OR;
  local_2c0[1] = 9;
  local_2c0[0] = NUMBER;
  local_2c8[1] = 0x17;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2b8,local_2c0 + 1,local_2c0,(int *)(local_2c8 + 1));
  local_2c8[0] = SUB;
  local_2d0[1] = 0x14;
  local_2d0[0] = NUMBER;
  local_2d8[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2c8,local_2d0 + 1,local_2d0,(int *)(local_2d8 + 1));
  local_2d8[0] = SHL;
  local_2e0[1] = 0x14;
  local_2e0[0] = NUMBER;
  local_2e8[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2d8,local_2e0 + 1,local_2e0,(int *)(local_2e8 + 1));
  local_2e8[0] = MOV;
  local_2f4[2] = 0x1b;
  local_2f4[1] = 0x28;
  local_2f4[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_2e8,local_2f4 + 2,(int *)(local_2f4 + 1),local_2f4);
  local_2f8 = JMP;
  local_2fc = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2f8,&local_2fc);
  local_304[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_304 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  local_304[0] = MOV;
  local_30c[1] = 9;
  local_30c[0] = NUMBER;
  local_314[1] = 0x47;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_304,local_30c + 1,local_30c,(int *)(local_314 + 1));
  local_314[0] = JMP;
  local_318 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_314,&local_318);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_read_char_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(eof_lab.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_read_char(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_port(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX, CELLS(5));
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RCX, CELLS(7)); // get the number of bytes read

  // rcx contains port
  // r11 contains index
  // r15 contains number of bytes read

  auto no_buffer_read = label_to_string(label++);
  auto eof_lab = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::R15);
  code.add(asmcode::JL, no_buffer_read);
  // start reading buffer
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX, CELLS(4)); // pointer to string
  code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);

#ifdef _WIN32
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::PUSH, asmcode::RDX);
  code.add(asmcode::PUSH, asmcode::R8);

  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RCX, CELLS(5)); // index
  code.add(asmcode::SAR, asmcode::R8, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RCX, CELLS(3)); // filehandle
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);

#else
  code.add(asmcode::PUSH, asmcode::RDI);
  code.add(asmcode::PUSH, asmcode::RSI);
  code.add(asmcode::PUSH, asmcode::RDX);

  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RCX, CELLS(3)); // filehandle
  code.add(asmcode::SAR, asmcode::RDI, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_RCX, CELLS(5)); // index
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::RSI, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RSI, asmcode::NUMBER, CELLS(1));
#endif

  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_read);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_read);
#endif  
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);

#ifdef _WIN32
  code.add(asmcode::POP, asmcode::R8);
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RCX);
#else
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RSI);
  code.add(asmcode::POP, asmcode::RDI);
#endif
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(7), asmcode::RAX); // store the number of bytes read
  code.add(asmcode::CMP, asmcode::RAX, asmcode::NUMBER, 0);
  code.add(asmcode::JES, eof_lab);
  code.add(asmcode::XOR, asmcode::R11, asmcode::R11);
  code.add(asmcode::LABEL, no_buffer_read);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RCX, CELLS(4));
  code.add(asmcode::SAR, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8); // get address to string
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, 8); // increase 8 for header
  code.add(asmcode::ADD, asmcode::R15, asmcode::R11);
  code.add(asmcode::MOV, asmcode::AL, asmcode::BYTE_MEM_R15);
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, char_tag);

  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::MEM_RCX, CELLS(5), asmcode::R11); //update index

  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, eof_lab);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, eof_tag);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_read_char_contract_violation);
    }
  }